

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMan.c
# Opt level: O1

void Mpm_ManPrintStatsInit(Mpm_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Mig_Man_t *p_00;
  Mpm_Par_t *pMVar6;
  uint uVar7;
  uint uVar8;
  
  uVar1 = p->nLutSize;
  uVar2 = p->nNumCuts;
  p_00 = p->pMig;
  iVar3 = (p_00->vCis).nSize;
  iVar4 = (p_00->vCos).nSize;
  iVar5 = p_00->nObjs;
  uVar7 = Mig_ManXorNum(p_00);
  uVar8 = Mig_ManMuxNum(p->pMig);
  pMVar6 = p->pPars;
  printf("K = %d.  C = %d.  Cand = %d. XOR = %d. MUX = %d. Choice = %d.  CutMin = %d. Truth = %d. DSD = %d.\n"
         ,(ulong)uVar1,(ulong)uVar2,(ulong)(uint)(iVar3 + iVar5 + ~(iVar4 + iVar3)),(ulong)uVar7,
         (ulong)uVar8,(ulong)(uint)p->pMig->nChoices,(ulong)(uint)pMVar6->fCutMin,
         (ulong)(uint)pMVar6->fUseTruth,(ulong)(uint)pMVar6->fUseDsd);
  return;
}

Assistant:

void Mpm_ManPrintStatsInit( Mpm_Man_t * p )
{
    printf( "K = %d.  C = %d.  Cand = %d. XOR = %d. MUX = %d. Choice = %d.  CutMin = %d. Truth = %d. DSD = %d.\n", 
        p->nLutSize, p->nNumCuts, Mig_ManCandNum(p->pMig), 
        Mig_ManXorNum(p->pMig), Mig_ManMuxNum(p->pMig), p->pMig->nChoices, 
        p->pPars->fCutMin, p->pPars->fUseTruth, p->pPars->fUseDsd );
}